

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_statemachine(Curl_easy *data,connectdata *conn)

{
  byte bVar1;
  _Bool _Var2;
  CURLcode CVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  char *local_e0;
  char *local_d0;
  char *local_b8;
  char *start;
  char *os;
  char *ptr_1;
  char *dir;
  dynbuf out;
  char *pcStack_50;
  _Bool entry_extracted;
  char *ptr;
  size_t sStack_40;
  _Bool done;
  size_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  int ftpcode;
  CURLcode result;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  nread = (size_t)&conn->proto;
  sStack_40 = 0;
  pp = (pingpong *)nread;
  _ftpcode = conn;
  conn_local = (connectdata *)data;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar3 = Curl_pp_flushsend(data,(pingpong *)nread);
    return CVar3;
  }
  ftpc._4_4_ = ftp_readresp(data,0,(pingpong *)nread,(int *)&ftpc,&stack0xffffffffffffffc0);
  if (ftpc._4_4_ != CURLE_OK) {
    return ftpc._4_4_;
  }
  if ((uint)ftpc != 0) {
    switch(*(undefined1 *)((long)&pp[1].recvbuf.leng + 6)) {
    case 1:
      if ((uint)ftpc == 0xe6) {
        if ((*(byte *)((long)&conn_local[1].proto + 0xd0) < 2) ||
           (((ulong)_ftpcode->bits >> 0x12 & 1) != 0)) {
          CVar3 = ftp_state_user_resp((Curl_easy *)conn_local,0xe6);
          return CVar3;
        }
      }
      else if ((uint)ftpc != 0xdc) {
        Curl_failf((Curl_easy *)conn_local,"Got a %03d ftp-server response when 220 was expected",
                   (ulong)(uint)ftpc);
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if ((*(char *)((long)&conn_local[1].proto + 0xd0) == '\0') ||
         (((ulong)_ftpcode->bits >> 0x12 & 1) != 0)) {
        ftpc._4_4_ = ftp_state_user((Curl_easy *)conn_local,_ftpcode);
      }
      else {
        *(undefined4 *)&pp[1].recvbuf.leng = 0;
        bVar1 = conn_local[1].secondary.remote_ip[0x25];
        if (bVar1 < 2) {
          *(undefined4 *)((long)&pp[1].recvbuf.bufr + 4) = 1;
          *(undefined4 *)&pp[1].recvbuf.bufr = 0;
        }
        else {
          if (bVar1 != 2) {
            Curl_failf((Curl_easy *)conn_local,"unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                       (ulong)(byte)conn_local[1].secondary.remote_ip[0x25]);
            return CURLE_UNKNOWN_OPTION;
          }
          *(undefined4 *)((long)&pp[1].recvbuf.bufr + 4) = 0xffffffff;
          *(undefined4 *)&pp[1].recvbuf.bufr = 1;
        }
        ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"AUTH %s",
                                   ftp_statemachine::ftpauth[*(int *)&pp[1].recvbuf.bufr]);
        if (ftpc._4_4_ == CURLE_OK) {
          _ftp_state((Curl_easy *)conn_local,'\x02');
        }
      }
      break;
    case 2:
      if (*(long *)(nread + 0x80) != 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (((uint)ftpc == 0xea) || ((uint)ftpc == 0x14e)) {
        _Var2 = Curl_conn_is_ssl(_ftpcode,0);
        if (!_Var2) {
          CVar3 = Curl_ssl_cfilter_add((Curl_easy *)conn_local,_ftpcode,0);
          if (CVar3 != CURLE_OK) {
            return CURLE_USE_SSL_FAILED;
          }
          ftpc._4_4_ = CURLE_OK;
        }
        ftpc._4_4_ = Curl_conn_connect((Curl_easy *)conn_local,0,true,(_Bool *)((long)&ptr + 7));
        if (ftpc._4_4_ == CURLE_OK) {
          _ftpcode->bits = (ConnectBits)((ulong)_ftpcode->bits & 0xfffffffffffdffff);
          _ftpcode->bits = (ConnectBits)((ulong)_ftpcode->bits & 0xfffffffffffbffff | 0x40000);
          ftpc._4_4_ = ftp_state_user((Curl_easy *)conn_local,_ftpcode);
        }
      }
      else if ((int)pp[1].recvbuf.leng < 1) {
        *(int *)&pp[1].recvbuf.leng = (int)pp[1].recvbuf.leng + 1;
        *(int *)&pp[1].recvbuf.bufr =
             *(int *)((long)&pp[1].recvbuf.bufr + 4) + *(int *)&pp[1].recvbuf.bufr;
        ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"AUTH %s",
                                   ftp_statemachine::ftpauth[*(int *)&pp[1].recvbuf.bufr]);
      }
      else if (*(byte *)((long)&conn_local[1].proto + 0xd0) < 2) {
        ftpc._4_4_ = ftp_state_user((Curl_easy *)conn_local,_ftpcode);
      }
      else {
        ftpc._4_4_ = CURLE_USE_SSL_FAILED;
      }
      break;
    case 3:
    case 4:
      ftpc._4_4_ = ftp_state_user_resp((Curl_easy *)conn_local,(uint)ftpc);
      break;
    case 5:
      ftpc._4_4_ = ftp_state_acct_resp((Curl_easy *)conn_local,(uint)ftpc);
      break;
    case 6:
      uVar7 = 0x50;
      if (*(char *)((long)&conn_local[1].proto + 0xd0) == '\x02') {
        uVar7 = 0x43;
      }
      ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"PROT %c",uVar7);
      if (ftpc._4_4_ == CURLE_OK) {
        _ftp_state((Curl_easy *)conn_local,'\a');
      }
      break;
    case 7:
      if ((int)(uint)ftpc / 100 == 2) {
        _ftpcode->bits =
             (ConnectBits)
             ((ulong)_ftpcode->bits & 0xfffffffffffdffff |
             (ulong)(*(char *)((long)&conn_local[1].proto + 0xd0) != '\x02') << 0x11);
      }
      else if (2 < *(byte *)((long)&conn_local[1].proto + 0xd0)) {
        return CURLE_USE_SSL_FAILED;
      }
      if (conn_local[1].secondary.remote_ip[0x26] == '\0') {
        ftpc._4_4_ = ftp_state_pwd((Curl_easy *)conn_local,_ftpcode);
      }
      else {
        ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"%s","CCC");
        if (ftpc._4_4_ == CURLE_OK) {
          _ftp_state((Curl_easy *)conn_local,'\b');
        }
      }
      break;
    case 8:
      if (((int)(uint)ftpc < 500) &&
         (ftpc._4_4_ = Curl_ssl_cfilter_remove
                                 ((Curl_easy *)conn_local,0,
                                  conn_local[1].secondary.remote_ip[0x26] == '\x02'),
         ftpc._4_4_ != CURLE_OK)) {
        Curl_failf((Curl_easy *)conn_local,"Failed to clear the command channel (CCC)");
      }
      if (ftpc._4_4_ == CURLE_OK) {
        ftpc._4_4_ = ftp_state_pwd((Curl_easy *)conn_local,_ftpcode);
      }
      break;
    case 9:
      if ((uint)ftpc == 0x101) {
        pcStack_50 = Curl_dyn_ptr((dynbuf *)(nread + 0x60));
        pcStack_50 = pcStack_50 + 4;
        out.toobig._7_1_ = 0;
        Curl_dyn_init((dynbuf *)&dir,1000);
        while( true ) {
          bVar8 = false;
          if ((*pcStack_50 != '\n') && (bVar8 = false, *pcStack_50 != '\0')) {
            bVar8 = *pcStack_50 != '\"';
          }
          if (!bVar8) break;
          pcStack_50 = pcStack_50 + 1;
        }
        pcVar6 = pcStack_50;
        if (*pcStack_50 == '\"') {
          while (pcStack_50 = pcVar6 + 1, *pcStack_50 != '\0') {
            if (*pcStack_50 == '\"') {
              if (pcVar6[2] != '\"') {
                sVar5 = Curl_dyn_len((dynbuf *)&dir);
                if (sVar5 != 0) {
                  out.toobig._7_1_ = 1;
                }
                break;
              }
              ftpc._4_4_ = Curl_dyn_addn((dynbuf *)&dir,pcVar6 + 2,1);
              pcStack_50 = pcVar6 + 2;
            }
            else {
              ftpc._4_4_ = Curl_dyn_addn((dynbuf *)&dir,pcStack_50,1);
            }
            pcVar6 = pcStack_50;
            if (ftpc._4_4_ != CURLE_OK) {
              return ftpc._4_4_;
            }
          }
        }
        if ((out.toobig._7_1_ & 1) == 0) {
          Curl_dyn_free((dynbuf *)&dir);
          if (((conn_local != (connectdata *)0x0) &&
              ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
             ((*(long *)&conn_local[3].shutdown.start[1].tv_usec == 0 ||
              (0 < *(int *)(*(long *)&conn_local[3].shutdown.start[1].tv_usec + 8))))) {
            Curl_infof((Curl_easy *)conn_local,"Failed to figure out path");
          }
        }
        else {
          pcVar6 = Curl_dyn_ptr((dynbuf *)&dir);
          if ((pp[1].sendbuf.leng == 0) && (*pcVar6 != '/')) {
            ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"%s","SYST");
            if (ftpc._4_4_ == CURLE_OK) {
              (*Curl_cfree)(pp[1].sendthis);
              pp[1].sendthis = (char *)0x0;
              pp[1].sendthis = pcVar6;
              if (((conn_local != (connectdata *)0x0) &&
                  ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
                 ((*(long *)&conn_local[3].shutdown.start[1].tv_usec == 0 ||
                  (0 < *(int *)(*(long *)&conn_local[3].shutdown.start[1].tv_usec + 8))))) {
                Curl_infof((Curl_easy *)conn_local,"Entry path is \'%s\'",pp[1].sendthis);
              }
              conn_local[3].http_proxy.host.name = pp[1].sendthis;
              _ftp_state((Curl_easy *)conn_local,'\n');
              return ftpc._4_4_;
            }
            (*Curl_cfree)(pcVar6);
            return ftpc._4_4_;
          }
          (*Curl_cfree)(pp[1].sendthis);
          pp[1].sendthis = (char *)0x0;
          pp[1].sendthis = pcVar6;
          if (((conn_local != (connectdata *)0x0) &&
              ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
             ((*(long *)&conn_local[3].shutdown.start[1].tv_usec == 0 ||
              (0 < *(int *)(*(long *)&conn_local[3].shutdown.start[1].tv_usec + 8))))) {
            Curl_infof((Curl_easy *)conn_local,"Entry path is \'%s\'",pp[1].sendthis);
          }
          conn_local[3].http_proxy.host.name = pp[1].sendthis;
        }
      }
      _ftp_state((Curl_easy *)conn_local,'\0');
      if ((((conn_local != (connectdata *)0x0) &&
           ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
          ((*(long *)&conn_local[3].shutdown.start[1].tv_usec == 0 ||
           (0 < *(int *)(*(long *)&conn_local[3].shutdown.start[1].tv_usec + 8))))) &&
         (0 < Curl_trc_feat_ftp.log_level)) {
        if ((conn_local == (connectdata *)0x0) ||
           ((conn_local->cpool_node)._next == (Curl_llist_node *)0x0)) {
          local_b8 = "???";
        }
        else {
          local_b8 = ftp_state_names
                     [*(byte *)((long)&(conn_local->cpool_node)._next[0x2a]._ptr + 6)];
        }
        Curl_trc_ftp((Curl_easy *)conn_local,"[%s] protocol connect phase DONE",local_b8);
      }
      break;
    case 10:
      if ((uint)ftpc == 0xd7) {
        pcVar6 = Curl_dyn_ptr((dynbuf *)(nread + 0x60));
        for (os = pcVar6 + 4; pcVar6 = os, *os == ' '; os = os + 1) {
        }
        while( true ) {
          bVar8 = false;
          if (*os != '\0') {
            bVar8 = *os != ' ';
          }
          if (!bVar8) break;
          os = os + 1;
        }
        pcVar6 = (char *)Curl_memdup0(pcVar6,(long)os - (long)pcVar6);
        if (pcVar6 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        iVar4 = curl_strequal(pcVar6,"OS/400");
        if (iVar4 != 0) {
          ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"%s","SITE NAMEFMT 1");
          if (ftpc._4_4_ == CURLE_OK) {
            (*Curl_cfree)((void *)pp[1].sendbuf.leng);
            pp[1].sendbuf.leng = 0;
            pp[1].sendbuf.leng = (size_t)pcVar6;
            _ftp_state((Curl_easy *)conn_local,'\v');
            return ftpc._4_4_;
          }
          (*Curl_cfree)(pcVar6);
          return ftpc._4_4_;
        }
        (*Curl_cfree)((void *)pp[1].sendbuf.leng);
        pp[1].sendbuf.leng = 0;
        pp[1].sendbuf.leng = (size_t)pcVar6;
      }
      _ftp_state((Curl_easy *)conn_local,'\0');
      if ((((conn_local != (connectdata *)0x0) &&
           ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
          ((*(long *)&conn_local[3].shutdown.start[1].tv_usec == 0 ||
           (0 < *(int *)(*(long *)&conn_local[3].shutdown.start[1].tv_usec + 8))))) &&
         (0 < Curl_trc_feat_ftp.log_level)) {
        if ((conn_local == (connectdata *)0x0) ||
           ((conn_local->cpool_node)._next == (Curl_llist_node *)0x0)) {
          local_d0 = "???";
        }
        else {
          local_d0 = ftp_state_names
                     [*(byte *)((long)&(conn_local->cpool_node)._next[0x2a]._ptr + 6)];
        }
        Curl_trc_ftp((Curl_easy *)conn_local,"[%s] protocol connect phase DONE",local_d0);
      }
      break;
    case 0xb:
      if ((uint)ftpc == 0xfa) {
        ftp_state_pwd((Curl_easy *)conn_local,_ftpcode);
      }
      else {
        _ftp_state((Curl_easy *)conn_local,'\0');
        if ((((conn_local != (connectdata *)0x0) &&
             ((*(ulong *)((long)&conn_local[1].proto.ftpc.prevpath + 2) >> 0x1c & 1) != 0)) &&
            ((*(long *)&conn_local[3].shutdown.start[1].tv_usec == 0 ||
             (0 < *(int *)(*(long *)&conn_local[3].shutdown.start[1].tv_usec + 8))))) &&
           (0 < Curl_trc_feat_ftp.log_level)) {
          if ((conn_local == (connectdata *)0x0) ||
             ((conn_local->cpool_node)._next == (Curl_llist_node *)0x0)) {
            local_e0 = "???";
          }
          else {
            local_e0 = ftp_state_names
                       [*(byte *)((long)&(conn_local->cpool_node)._next[0x2a]._ptr + 6)];
          }
          Curl_trc_ftp((Curl_easy *)conn_local,"[%s] protocol connect phase DONE",local_e0);
        }
      }
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      if (((int)(uint)ftpc < 400) || (*(int *)((long)&pp[1].recvbuf.bufr + 4) != 0)) {
        ftpc._4_4_ = ftp_state_quote((Curl_easy *)conn_local,false,
                                     *(ftpstate *)((long)&pp[1].recvbuf.leng + 6));
      }
      else {
        Curl_failf((Curl_easy *)conn_local,"QUOT command failed with %03d",(ulong)(uint)ftpc);
        ftpc._4_4_ = CURLE_QUOTE_ERROR;
      }
      break;
    case 0x10:
      if ((int)(uint)ftpc / 100 == 2) {
        *(undefined4 *)((long)&pp[1].recvbuf.bufr + 4) = 0;
        iVar4 = *(int *)((long)&pp[1].sendbuf.toobig + 4) + 1;
        *(int *)((long)&pp[1].sendbuf.toobig + 4) = iVar4;
        if ((int)pp[1].sendbuf.toobig < iVar4) {
          ftpc._4_4_ = ftp_state_mdtm((Curl_easy *)conn_local);
        }
        else {
          ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"CWD %s",
                                     *(undefined8 *)
                                      (pp[1].sendsize +
                                      (long)(*(int *)((long)&pp[1].sendbuf.toobig + 4) + -1) * 8));
        }
      }
      else if (((conn_local[1].secondary.local_ip[0x16] == '\0') ||
               (*(int *)((long)&pp[1].sendbuf.toobig + 4) == 0)) ||
              (*(int *)((long)&pp[1].recvbuf.bufr + 4) != 0)) {
        Curl_failf((Curl_easy *)conn_local,"Server denied you to change to the given directory",
                   (long)(int)(uint)ftpc % 100 & 0xffffffff);
        *(byte *)((long)&pp[1].recvbuf.allc + 2) =
             *(byte *)((long)&pp[1].recvbuf.allc + 2) & 0xef | 0x10;
        ftpc._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        *(int *)((long)&pp[1].recvbuf.bufr + 4) = *(int *)((long)&pp[1].recvbuf.bufr + 4) + 1;
        *(uint *)&pp[1].recvbuf.leng = (uint)(conn_local[1].secondary.local_ip[0x16] == '\x02');
        ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"MKD %s",
                                   *(undefined8 *)
                                    (pp[1].sendsize +
                                    (long)(*(int *)((long)&pp[1].sendbuf.toobig + 4) + -1) * 8));
        if (ftpc._4_4_ == CURLE_OK) {
          _ftp_state((Curl_easy *)conn_local,'\x11');
        }
      }
      break;
    case 0x11:
      if (((int)(uint)ftpc / 100 == 2) ||
         (iVar4 = (int)pp[1].recvbuf.leng, *(int *)&pp[1].recvbuf.leng = iVar4 + -1, iVar4 != 0)) {
        _ftp_state((Curl_easy *)conn_local,'\x10');
        ftpc._4_4_ = Curl_pp_sendf((Curl_easy *)conn_local,pp,"CWD %s",
                                   *(undefined8 *)
                                    (pp[1].sendsize +
                                    (long)(*(int *)((long)&pp[1].sendbuf.toobig + 4) + -1) * 8));
      }
      else {
        Curl_failf((Curl_easy *)conn_local,"Failed to MKD dir: %03d",(ulong)(uint)ftpc);
        ftpc._4_4_ = CURLE_REMOTE_ACCESS_DENIED;
      }
      break;
    case 0x12:
      ftpc._4_4_ = ftp_state_mdtm_resp((Curl_easy *)conn_local,(uint)ftpc);
      break;
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
      ftpc._4_4_ = ftp_state_type_resp((Curl_easy *)conn_local,(uint)ftpc,
                                       *(ftpstate *)((long)&pp[1].recvbuf.leng + 6));
      break;
    case 0x17:
    case 0x18:
    case 0x19:
      ftpc._4_4_ = ftp_state_size_resp((Curl_easy *)conn_local,(uint)ftpc,
                                       *(ftpstate *)((long)&pp[1].recvbuf.leng + 6));
      break;
    case 0x1a:
    case 0x1b:
      ftpc._4_4_ = ftp_state_rest_resp((Curl_easy *)conn_local,_ftpcode,(uint)ftpc,
                                       *(ftpstate *)((long)&pp[1].recvbuf.leng + 6));
      break;
    case 0x1c:
      ftpc._4_4_ = ftp_state_port_resp((Curl_easy *)conn_local,(uint)ftpc);
      break;
    case 0x1d:
      if ((uint)ftpc != 200) {
        Curl_failf((Curl_easy *)conn_local,"PRET command not accepted: %03d",(ulong)(uint)ftpc);
        return CURLE_FTP_PRET_FAILED;
      }
      ftpc._4_4_ = ftp_state_use_pasv((Curl_easy *)conn_local,_ftpcode);
      break;
    case 0x1e:
      ftpc._4_4_ = ftp_state_pasv_resp((Curl_easy *)conn_local,(uint)ftpc);
      break;
    case 0x1f:
    case 0x20:
      ftpc._4_4_ = ftp_state_get_resp((Curl_easy *)conn_local,(uint)ftpc,
                                      *(ftpstate *)((long)&pp[1].recvbuf.leng + 6));
      break;
    case 0x21:
      ftpc._4_4_ = ftp_state_stor_resp((Curl_easy *)conn_local,(uint)ftpc,
                                       *(ftpstate *)((long)&pp[1].recvbuf.leng + 6));
      break;
    case 0x22:
    default:
      _ftp_state((Curl_easy *)conn_local,'\0');
    }
  }
  return ftpc._4_4_;
}

Assistant:

static CURLcode ftp_statemachine(struct Curl_easy *data,
                                 struct connectdata *conn)
{
  CURLcode result;
  int ftpcode;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  static const char * const ftpauth[] = { "SSL", "TLS" };
  size_t nread = 0;

  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

  result = ftp_readresp(data, FIRSTSOCKET, pp, &ftpcode, &nread);
  if(result)
    return result;

  if(ftpcode) {
    /* we have now received a full FTP server response */
    switch(ftpc->state) {
    case FTP_WAIT220:
      if(ftpcode == 230) {
        /* 230 User logged in - already! Take as 220 if TLS required. */
        if(data->set.use_ssl <= CURLUSESSL_TRY ||
           conn->bits.ftp_use_control_ssl)
          return ftp_state_user_resp(data, ftpcode);
      }
      else if(ftpcode != 220) {
        failf(data, "Got a %03d ftp-server response when 220 was expected",
              ftpcode);
        return CURLE_WEIRD_SERVER_REPLY;
      }

      /* We have received a 220 response fine, now we proceed. */
#ifdef HAVE_GSSAPI
      if(data->set.krb) {
        /* If not anonymous login, try a secure login. Note that this
           procedure is still BLOCKING. */

        Curl_sec_request_prot(conn, "private");
        /* We set private first as default, in case the line below fails to
           set a valid level */
        Curl_sec_request_prot(conn, data->set.str[STRING_KRB_LEVEL]);

        if(Curl_sec_login(data, conn)) {
          failf(data, "secure login failed");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        infof(data, "Authentication successful");
      }
#endif

      if(data->set.use_ssl && !conn->bits.ftp_use_control_ssl) {
        /* We do not have a SSL/TLS control connection yet, but FTPS is
           requested. Try a FTPS connection now */

        ftpc->count3 = 0;
        switch(data->set.ftpsslauth) {
        case CURLFTPAUTH_DEFAULT:
        case CURLFTPAUTH_SSL:
          ftpc->count2 = 1; /* add one to get next */
          ftpc->count1 = 0;
          break;
        case CURLFTPAUTH_TLS:
          ftpc->count2 = -1; /* subtract one to get next */
          ftpc->count1 = 1;
          break;
        default:
          failf(data, "unsupported parameter to CURLOPT_FTPSSLAUTH: %d",
                (int)data->set.ftpsslauth);
          return CURLE_UNKNOWN_OPTION; /* we do not know what to do */
        }
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        if(!result)
          ftp_state(data, FTP_AUTH);
      }
      else
        result = ftp_state_user(data, conn);
      break;

    case FTP_AUTH:
      /* we have gotten the response to a previous AUTH command */

      if(pp->overflow)
        return CURLE_WEIRD_SERVER_REPLY; /* Forbid pipelining in response. */

      /* RFC2228 (page 5) says:
       *
       * If the server is willing to accept the named security mechanism,
       * and does not require any security data, it must respond with
       * reply code 234/334.
       */

      if((ftpcode == 234) || (ftpcode == 334)) {
        /* this was BLOCKING, keep it so for now */
        bool done;
        if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
          result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
          if(result) {
            /* we failed and bail out */
            return CURLE_USE_SSL_FAILED;
          }
        }
        result = Curl_conn_connect(data, FIRSTSOCKET, TRUE, &done);
        if(!result) {
          conn->bits.ftp_use_data_ssl = FALSE; /* clear-text data */
          conn->bits.ftp_use_control_ssl = TRUE; /* SSL on control */
          result = ftp_state_user(data, conn);
        }
      }
      else if(ftpc->count3 < 1) {
        ftpc->count3++;
        ftpc->count1 += ftpc->count2; /* get next attempt */
        result = Curl_pp_sendf(data, &ftpc->pp, "AUTH %s",
                               ftpauth[ftpc->count1]);
        /* remain in this same state */
      }
      else {
        if(data->set.use_ssl > CURLUSESSL_TRY)
          /* we failed and CURLUSESSL_CONTROL or CURLUSESSL_ALL is set */
          result = CURLE_USE_SSL_FAILED;
        else
          /* ignore the failure and continue */
          result = ftp_state_user(data, conn);
      }
      break;

    case FTP_USER:
    case FTP_PASS:
      result = ftp_state_user_resp(data, ftpcode);
      break;

    case FTP_ACCT:
      result = ftp_state_acct_resp(data, ftpcode);
      break;

    case FTP_PBSZ:
      result =
        Curl_pp_sendf(data, &ftpc->pp, "PROT %c",
                      data->set.use_ssl == CURLUSESSL_CONTROL ? 'C' : 'P');
      if(!result)
        ftp_state(data, FTP_PROT);
      break;

    case FTP_PROT:
      if(ftpcode/100 == 2)
        /* We have enabled SSL for the data connection! */
        conn->bits.ftp_use_data_ssl =
          (data->set.use_ssl != CURLUSESSL_CONTROL) ? TRUE : FALSE;
      /* FTP servers typically responds with 500 if they decide to reject
         our 'P' request */
      else if(data->set.use_ssl > CURLUSESSL_CONTROL)
        /* we failed and bails out */
        return CURLE_USE_SSL_FAILED;

      if(data->set.ftp_ccc) {
        /* CCC - Clear Command Channel
         */
        result = Curl_pp_sendf(data, &ftpc->pp, "%s", "CCC");
        if(!result)
          ftp_state(data, FTP_CCC);
      }
      else
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_CCC:
      if(ftpcode < 500) {
        /* First shut down the SSL layer (note: this call will block) */
        /* This has only been tested on the proftpd server, and the mod_tls
         * code sends a close notify alert without waiting for a close notify
         * alert in response. Thus we wait for a close notify alert from the
         * server, but we do not send one. Let's hope other servers do
         * the same... */
        result = Curl_ssl_cfilter_remove(data, FIRSTSOCKET,
          (data->set.ftp_ccc == CURLFTPSSL_CCC_ACTIVE));

        if(result)
          failf(data, "Failed to clear the command channel (CCC)");
      }
      if(!result)
        /* Then continue as normal */
        result = ftp_state_pwd(data, conn);
      break;

    case FTP_PWD:
      if(ftpcode == 257) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        bool entry_extracted = FALSE;
        struct dynbuf out;
        Curl_dyn_init(&out, 1000);

        /* Reply format is like
           257<space>[rubbish]"<directory-name>"<space><commentary> and the
           RFC959 says

           The directory name can contain any character; embedded
           double-quotes should be escaped by double-quotes (the
           "quote-doubling" convention).
        */

        /* scan for the first double-quote for non-standard responses */
        while(*ptr != '\n' && *ptr != '\0' && *ptr != '"')
          ptr++;

        if('\"' == *ptr) {
          /* it started good */
          for(ptr++; *ptr; ptr++) {
            if('\"' == *ptr) {
              if('\"' == ptr[1]) {
                /* "quote-doubling" */
                result = Curl_dyn_addn(&out, &ptr[1], 1);
                ptr++;
              }
              else {
                /* end of path */
                if(Curl_dyn_len(&out))
                  entry_extracted = TRUE;
                break; /* get out of this loop */
              }
            }
            else
              result = Curl_dyn_addn(&out, ptr, 1);
            if(result)
              return result;
          }
        }
        if(entry_extracted) {
          /* If the path name does not look like an absolute path (i.e.: it
             does not start with a '/'), we probably need some server-dependent
             adjustments. For example, this is the case when connecting to
             an OS400 FTP server: this server supports two name syntaxes,
             the default one being incompatible with standard paths. In
             addition, this server switches automatically to the regular path
             syntax when one is encountered in a command: this results in
             having an entrypath in the wrong syntax when later used in CWD.
               The method used here is to check the server OS: we do it only
             if the path name looks strange to minimize overhead on other
             systems. */
          char *dir = Curl_dyn_ptr(&out);

          if(!ftpc->server_os && dir[0] != '/') {
            result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SYST");
            if(result) {
              free(dir);
              return result;
            }
            Curl_safefree(ftpc->entrypath);
            ftpc->entrypath = dir; /* remember this */
            infof(data, "Entry path is '%s'", ftpc->entrypath);
            /* also save it where getinfo can access it: */
            data->state.most_recent_ftp_entrypath = ftpc->entrypath;
            ftp_state(data, FTP_SYST);
            break;
          }

          Curl_safefree(ftpc->entrypath);
          ftpc->entrypath = dir; /* remember this */
          infof(data, "Entry path is '%s'", ftpc->entrypath);
          /* also save it where getinfo can access it: */
          data->state.most_recent_ftp_entrypath = ftpc->entrypath;
        }
        else {
          /* could not get the path */
          Curl_dyn_free(&out);
          infof(data, "Failed to figure out path");
        }
      }
      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_SYST:
      if(ftpcode == 215) {
        char *ptr = Curl_dyn_ptr(&pp->recvbuf) + 4; /* start on the first
                                                       letter */
        char *os;
        char *start;

        /* Reply format is like
           215<space><OS-name><space><commentary>
        */
        while(*ptr == ' ')
          ptr++;
        for(start = ptr; *ptr && *ptr != ' '; ptr++)
          ;
        os = Curl_memdup0(start, ptr - start);
        if(!os)
          return CURLE_OUT_OF_MEMORY;

        /* Check for special servers here. */
        if(strcasecompare(os, "OS/400")) {
          /* Force OS400 name format 1. */
          result = Curl_pp_sendf(data, &ftpc->pp, "%s", "SITE NAMEFMT 1");
          if(result) {
            free(os);
            return result;
          }
          /* remember target server OS */
          Curl_safefree(ftpc->server_os);
          ftpc->server_os = os;
          ftp_state(data, FTP_NAMEFMT);
          break;
        }
        /* Nothing special for the target server. */
        /* remember target server OS */
        Curl_safefree(ftpc->server_os);
        ftpc->server_os = os;
      }
      else {
        /* Cannot identify server OS. Continue anyway and cross fingers. */
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_NAMEFMT:
      if(ftpcode == 250) {
        /* Name format change successful: reload initial path. */
        ftp_state_pwd(data, conn);
        break;
      }

      ftp_state(data, FTP_STOP); /* we are done with the CONNECT phase! */
      CURL_TRC_FTP(data, "[%s] protocol connect phase DONE", FTP_DSTATE(data));
      break;

    case FTP_QUOTE:
    case FTP_POSTQUOTE:
    case FTP_RETR_PREQUOTE:
    case FTP_STOR_PREQUOTE:
      if((ftpcode >= 400) && !ftpc->count2) {
        /* failure response code, and not allowed to fail */
        failf(data, "QUOT command failed with %03d", ftpcode);
        result = CURLE_QUOTE_ERROR;
      }
      else
        result = ftp_state_quote(data, FALSE, ftpc->state);
      break;

    case FTP_CWD:
      if(ftpcode/100 != 2) {
        /* failure to CWD there */
        if(data->set.ftp_create_missing_dirs &&
           ftpc->cwdcount && !ftpc->count2) {
          /* try making it */
          ftpc->count2++; /* counter to prevent CWD-MKD loops */

          /* count3 is set to allow MKD to fail once per dir. In the case when
          CWD fails and then MKD fails (due to another session raced it to
          create the dir) this then allows for a second try to CWD to it. */
          ftpc->count3 = (data->set.ftp_create_missing_dirs == 2) ? 1 : 0;

          result = Curl_pp_sendf(data, &ftpc->pp, "MKD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
          if(!result)
            ftp_state(data, FTP_MKD);
        }
        else {
          /* return failure */
          failf(data, "Server denied you to change to the given directory");
          ftpc->cwdfail = TRUE; /* do not remember this path as we failed
                                   to enter it */
          result = CURLE_REMOTE_ACCESS_DENIED;
        }
      }
      else {
        /* success */
        ftpc->count2 = 0;
        if(++ftpc->cwdcount <= ftpc->dirdepth)
          /* send next CWD */
          result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                                 ftpc->dirs[ftpc->cwdcount - 1]);
        else
          result = ftp_state_mdtm(data);
      }
      break;

    case FTP_MKD:
      if((ftpcode/100 != 2) && !ftpc->count3--) {
        /* failure to MKD the dir */
        failf(data, "Failed to MKD dir: %03d", ftpcode);
        result = CURLE_REMOTE_ACCESS_DENIED;
      }
      else {
        ftp_state(data, FTP_CWD);
        /* send CWD */
        result = Curl_pp_sendf(data, &ftpc->pp, "CWD %s",
                               ftpc->dirs[ftpc->cwdcount - 1]);
      }
      break;

    case FTP_MDTM:
      result = ftp_state_mdtm_resp(data, ftpcode);
      break;

    case FTP_TYPE:
    case FTP_LIST_TYPE:
    case FTP_RETR_TYPE:
    case FTP_STOR_TYPE:
      result = ftp_state_type_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_SIZE:
    case FTP_RETR_SIZE:
    case FTP_STOR_SIZE:
      result = ftp_state_size_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_REST:
    case FTP_RETR_REST:
      result = ftp_state_rest_resp(data, conn, ftpcode, ftpc->state);
      break;

    case FTP_PRET:
      if(ftpcode != 200) {
        /* there only is this one standard OK return code. */
        failf(data, "PRET command not accepted: %03d", ftpcode);
        return CURLE_FTP_PRET_FAILED;
      }
      result = ftp_state_use_pasv(data, conn);
      break;

    case FTP_PASV:
      result = ftp_state_pasv_resp(data, ftpcode);
      break;

    case FTP_PORT:
      result = ftp_state_port_resp(data, ftpcode);
      break;

    case FTP_LIST:
    case FTP_RETR:
      result = ftp_state_get_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_STOR:
      result = ftp_state_stor_resp(data, ftpcode, ftpc->state);
      break;

    case FTP_QUIT:
    default:
      /* internal error */
      ftp_state(data, FTP_STOP);
      break;
    }
  } /* if(ftpcode) */

  return result;
}